

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# delta_length_byte_array_decoder.cpp
# Opt level: O2

void __thiscall
duckdb::DeltaLengthByteArrayDecoder::SkipInternal<true>
          (DeltaLengthByteArrayDecoder *this,uint8_t *defines,idx_t skip_count)

{
  data_ptr_t pdVar1;
  type this_00;
  IOException *this_01;
  uint64_t increment;
  idx_t iVar2;
  idx_t iVar3;
  idx_t iVar4;
  allocator local_41;
  string local_40;
  
  this_00 = shared_ptr<duckdb::ResizeableBuffer,_true>::operator*(&this->reader->block);
  pdVar1 = (this->length_buffer->super_ByteBuffer).ptr;
  increment = 0;
  iVar4 = 0;
  iVar2 = this->length_idx;
  do {
    if (skip_count == iVar4) {
      ByteBuffer::inc(&this_00->super_ByteBuffer,increment);
      return;
    }
    iVar3 = iVar2;
    if (this->reader->column_schema->max_define == (ulong)defines[iVar4]) {
      if (this->byte_array_count <= iVar2) {
        this_01 = (IOException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&local_40,
                   "DELTA_LENGTH_BYTE_ARRAY - length mismatch between values and byte array lengths (attempted read of %d from %d entries) - corrupt file?"
                   ,&local_41);
        IOException::IOException<unsigned_long,unsigned_long>
                  (this_01,&local_40,this->length_idx,this->byte_array_count);
        __cxa_throw(this_01,&IOException::typeinfo,::std::runtime_error::~runtime_error);
      }
      iVar3 = iVar2 + 1;
      this->length_idx = iVar3;
      increment = increment + *(uint *)(pdVar1 + iVar2 * 4);
    }
    iVar4 = iVar4 + 1;
    iVar2 = iVar3;
  } while( true );
}

Assistant:

void DeltaLengthByteArrayDecoder::SkipInternal(uint8_t *defines, idx_t skip_count) {
	auto &block = *reader.block;
	const auto length_data = reinterpret_cast<uint32_t *>(length_buffer.ptr);

	if (!HAS_DEFINES) {
		// Fast path: take this out of the loop below
		if (length_idx + skip_count > byte_array_count) {
			throw IOException(
			    "DELTA_LENGTH_BYTE_ARRAY - length mismatch between values and byte array lengths (attempted "
			    "read of %d from %d entries) - corrupt file?",
			    length_idx + skip_count, byte_array_count);
		}
	}

	idx_t skip_bytes = 0;
	for (idx_t row_idx = 0; row_idx < skip_count; row_idx++) {
		if (HAS_DEFINES) {
			if (defines[row_idx] != reader.MaxDefine()) {
				continue;
			}
			if (length_idx >= byte_array_count) {
				throw IOException(
				    "DELTA_LENGTH_BYTE_ARRAY - length mismatch between values and byte array lengths (attempted "
				    "read of %d from %d entries) - corrupt file?",
				    length_idx, byte_array_count);
			}
		}
		skip_bytes += length_data[length_idx++];
	}
	block.inc(skip_bytes);
}